

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3<double> * pbrt::Cross<double>(Vector3<double> *v,Vector3<double> *w)

{
  double in_RDX;
  Vector3<double> *in_RDI;
  Vector3<double> *this;
  double d;
  double in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd8;
  double in_stack_ffffffffffffffe0;
  Vector3<double> *b;
  
  b = in_RDI;
  this = (Vector3<double> *)
         DifferenceOfProducts<double,double,double,double>
                   (in_RDX,(double)in_RDI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  d = DifferenceOfProducts<double,double,double,double>
                (in_RDX,(double)b,(double)this,in_stack_ffffffffffffffd8);
  DifferenceOfProducts<double,double,double,double>(in_RDX,(double)b,(double)this,d);
  Vector3<double>::Vector3(this,d,(double)in_RDI,in_stack_ffffffffffffffc8);
  return b;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}